

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *pInLimit;
  BYTE *pBVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long *plVar16;
  long *plVar17;
  BYTE *pBVar18;
  size_t sVar19;
  byte bVar20;
  U32 UVar21;
  int *piVar22;
  long *plVar23;
  long *plVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  long *plVar31;
  int iVar32;
  uint uVar33;
  BYTE *pBVar34;
  ulong uVar35;
  seqDef *psVar36;
  int iVar37;
  U32 UVar38;
  ulong uVar39;
  uint local_c4;
  U32 local_a4;
  ulong local_90;
  BYTE *litLimit_w;
  BYTE *litLimit_w_3;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3da5,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar28 = (ms->cParams).minMatch;
  pUVar7 = ms->hashTable;
  uVar4 = (ms->cParams).targetLength;
  uVar15 = (ulong)(uVar4 + 1 + (uint)(uVar4 == 0));
  pBVar8 = (ms->window).base;
  pInLimit = (long *)((long)src + srcSize);
  iVar37 = (int)pBVar8;
  iVar32 = (int)pInLimit - iVar37;
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar4 = (ms->window).dictLimit;
  uVar14 = iVar32 - uVar13;
  if (iVar32 - uVar4 <= uVar13) {
    uVar14 = uVar4;
  }
  pBVar34 = pBVar8 + uVar14;
  plVar16 = (long *)((long)src + (srcSize - 8));
  uVar4 = rep[1];
  plVar23 = (long *)((long)src + (ulong)(pBVar34 == (BYTE *)src));
  plVar17 = (long *)((long)src + (ulong)(pBVar34 == (BYTE *)src) + 1);
  uVar13 = (int)plVar23 - (int)pBVar34;
  local_c4 = uVar4;
  if (uVar13 < uVar4) {
    local_c4 = 0;
  }
  uVar5 = *rep;
  uVar25 = 0;
  if (uVar5 <= uVar13) {
    uVar25 = uVar5;
  }
  local_90 = (ulong)uVar25;
  cVar12 = (char)(ms->cParams).hashLog;
  plVar31 = (long *)src;
  if (uVar28 == 5) {
    bVar20 = 0x40 - cVar12;
    plVar2 = pInLimit + -4;
    do {
      lVar27 = -local_90;
      while( true ) {
        uVar28 = (uint)local_90;
        if (plVar16 <= plVar17) goto LAB_0010e445;
        lVar9 = *plVar23;
        uVar30 = (ulong)(lVar9 * -0x30e4432345000000) >> (bVar20 & 0x3f);
        lVar10 = *plVar17;
        uVar35 = (ulong)(lVar10 * -0x30e4432345000000) >> (bVar20 & 0x3f);
        uVar39 = (long)plVar23 - (long)pBVar8;
        uVar25 = pUVar7[uVar30];
        uVar6 = pUVar7[uVar35];
        UVar38 = (U32)uVar39;
        pUVar7[uVar30] = UVar38;
        pUVar7[uVar35] = (int)plVar17 - iVar37;
        if ((long *)((long)plVar23 + 1U) != plVar17) goto LAB_0010e49e;
        if ((uVar28 != 0) && (*(int *)((long)plVar23 + lVar27 + 2) == *(int *)((long)plVar23 + 2)))
        {
          uVar30 = (ulong)(*(char *)((long)plVar23 + 1U) == *(char *)((long)plVar23 + lVar27 + 1));
          plVar17 = (long *)((long)plVar23 + (2 - uVar30));
          pBVar18 = (BYTE *)((long)plVar23 + ((lVar27 + 2) - uVar30));
          local_a4 = 1;
          goto LAB_0010dc10;
        }
        if (((uVar14 < uVar25) &&
            (piVar22 = (int *)(pBVar8 + uVar25), plVar24 = plVar23, *piVar22 == (int)lVar9)) ||
           ((uVar14 < uVar6 &&
            (piVar22 = (int *)(pBVar8 + uVar6), plVar24 = plVar17, *piVar22 == (int)lVar10))))
        break;
        uVar30 = ((ulong)((long)plVar23 - (long)plVar31) >> 7) + uVar15;
        if (uVar30 < 2) goto LAB_0010e4bd;
        plVar23 = (long *)((long)plVar23 + uVar30);
        plVar17 = (long *)((long)plVar17 + uVar30);
      }
      uVar25 = (int)plVar24 - (int)piVar22;
      local_90 = (ulong)uVar25;
      lVar27 = 0;
      while( true ) {
        pBVar18 = (BYTE *)((long)piVar22 + lVar27);
        plVar17 = (long *)((long)plVar24 + lVar27);
        if (((pBVar18 <= pBVar34) || (plVar17 <= plVar31)) ||
           (*(char *)((long)plVar24 + lVar27 + -1) != *(char *)((long)piVar22 + lVar27 + -1)))
        break;
        lVar27 = lVar27 + -1;
      }
      local_a4 = uVar25 + 3;
      uVar30 = -lVar27;
      local_c4 = uVar28;
LAB_0010dc10:
      sVar19 = ZSTD_count((BYTE *)((long)plVar17 + uVar30 + 4),pBVar18 + uVar30 + 4,(BYTE *)pInLimit
                         );
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_0010e4dc;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0010e4fb;
      uVar35 = (long)plVar17 - (long)plVar31;
      plVar23 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar23 + uVar35))
      goto LAB_0010e51a;
      if (pInLimit < plVar17) goto LAB_0010e539;
      if (plVar2 < plVar17) {
        ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar31,(BYTE *)plVar17,(BYTE *)plVar2);
LAB_0010dcad:
        seqStore->lit = seqStore->lit + uVar35;
        if (0xffff < uVar35) {
          if (seqStore->longLengthID != 0) goto LAB_0010e5b5;
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar27 = plVar31[1];
        *plVar23 = *plVar31;
        plVar23[1] = lVar27;
        pBVar18 = seqStore->lit;
        if (0x10 < uVar35) {
          lVar27 = (long)(pBVar18 + 0x10) - (long)(plVar31 + 2);
          if (lVar27 < 8) {
            if (-0x10 < lVar27) goto LAB_0010e5f3;
          }
          else if (0xffffffffffffffe0 < lVar27 - 0x10U) goto LAB_0010e5d4;
          lVar27 = plVar31[3];
          *(long *)(pBVar18 + 0x10) = plVar31[2];
          *(long *)(pBVar18 + 0x18) = lVar27;
          if (0x20 < (long)uVar35) {
            lVar27 = 0;
            do {
              puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x20);
              uVar11 = puVar3[1];
              pBVar1 = pBVar18 + lVar27 + 0x20;
              *(undefined8 *)pBVar1 = *puVar3;
              *(undefined8 *)(pBVar1 + 8) = uVar11;
              puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x30);
              uVar11 = puVar3[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar1 + 0x18) = uVar11;
              lVar27 = lVar27 + 0x20;
            } while (pBVar1 + 0x20 < pBVar18 + uVar35);
          }
          goto LAB_0010dcad;
        }
        seqStore->lit = pBVar18 + uVar35;
      }
      uVar26 = sVar19 + uVar30 + 1;
      psVar36 = seqStore->sequences;
      psVar36->litLength = (U16)uVar35;
      psVar36->offset = local_a4;
      if (0xffff < uVar26) {
        if (seqStore->longLengthID != 0) goto LAB_0010e558;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar36->matchLength = (U16)uVar26;
      psVar36 = psVar36 + 1;
      seqStore->sequences = psVar36;
      plVar23 = (long *)((long)plVar17 + sVar19 + uVar30 + 4);
      plVar17 = (long *)((long)plVar17 + sVar19 + uVar30 + 5);
      plVar31 = plVar23;
      if (plVar23 <= plVar16) {
        if (pBVar8 + (uVar39 & 0xffffffff) + 2 <= src) goto LAB_0010e596;
        pUVar7[(ulong)(*(long *)(pBVar8 + (uVar39 & 0xffffffff) + 2) * -0x30e4432345000000) >>
               (bVar20 & 0x3f)] = UVar38 + 2;
        pUVar7[(ulong)(*(long *)((long)plVar23 - 2) * -0x30e4432345000000) >> (bVar20 & 0x3f)] =
             ((int)plVar23 + -2) - iVar37;
        while( true ) {
          uVar28 = (uint)local_90;
          plVar31 = plVar23;
          if (((local_c4 == 0) || (plVar16 < plVar23)) ||
             ((int)*plVar23 != *(int *)((long)plVar23 - (ulong)local_c4))) break;
          sVar19 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                              (BYTE *)((long)plVar23 + (4 - (ulong)local_c4)),(BYTE *)pInLimit);
          pUVar7[(ulong)(*plVar23 * -0x30e4432345000000) >> (bVar20 & 0x3f)] = (int)plVar23 - iVar37
          ;
          if (seqStore->maxNbSeq <= (ulong)((long)psVar36 - (long)seqStore->sequencesStart >> 3))
          goto LAB_0010e4dc;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0010e4fb;
          plVar17 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < plVar17) goto LAB_0010e51a;
          if (pInLimit < plVar23) goto LAB_0010e539;
          if (plVar2 < plVar23) {
            ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar2);
          }
          else {
            lVar27 = plVar23[1];
            *plVar17 = *plVar23;
            plVar17[1] = lVar27;
          }
          psVar36 = seqStore->sequences;
          psVar36->litLength = 0;
          psVar36->offset = 1;
          if (0xffff < sVar19 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_0010e558;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar17 = (long *)((long)plVar23 + sVar19 + 5);
          plVar23 = (long *)((long)plVar23 + sVar19 + 4);
          psVar36->matchLength = (U16)(sVar19 + 1);
          psVar36 = psVar36 + 1;
          seqStore->sequences = psVar36;
          local_90 = (ulong)local_c4;
          local_c4 = uVar28;
        }
      }
    } while( true );
  }
  if (uVar28 == 6) {
    bVar20 = 0x40 - cVar12;
    plVar2 = pInLimit + -4;
    do {
      lVar27 = -local_90;
      while( true ) {
        uVar28 = (uint)local_90;
        if (plVar16 <= plVar17) goto LAB_0010e445;
        lVar9 = *plVar23;
        uVar30 = (ulong)(lVar9 * -0x30e4432340650000) >> (bVar20 & 0x3f);
        lVar10 = *plVar17;
        uVar35 = (ulong)(lVar10 * -0x30e4432340650000) >> (bVar20 & 0x3f);
        uVar39 = (long)plVar23 - (long)pBVar8;
        uVar25 = pUVar7[uVar30];
        uVar6 = pUVar7[uVar35];
        UVar38 = (U32)uVar39;
        pUVar7[uVar30] = UVar38;
        pUVar7[uVar35] = (int)plVar17 - iVar37;
        if ((long *)((long)plVar23 + 1U) != plVar17) goto LAB_0010e49e;
        if ((uVar28 != 0) && (*(int *)((long)plVar23 + lVar27 + 2) == *(int *)((long)plVar23 + 2)))
        {
          uVar30 = (ulong)(*(char *)((long)plVar23 + 1U) == *(char *)((long)plVar23 + lVar27 + 1));
          plVar17 = (long *)((long)plVar23 + (2 - uVar30));
          pBVar18 = (BYTE *)((long)plVar23 + ((lVar27 + 2) - uVar30));
          local_a4 = 1;
          goto LAB_0010d733;
        }
        if (((uVar14 < uVar25) &&
            (piVar22 = (int *)(pBVar8 + uVar25), plVar24 = plVar23, *piVar22 == (int)lVar9)) ||
           ((uVar14 < uVar6 &&
            (piVar22 = (int *)(pBVar8 + uVar6), plVar24 = plVar17, *piVar22 == (int)lVar10))))
        break;
        uVar30 = ((ulong)((long)plVar23 - (long)plVar31) >> 7) + uVar15;
        if (uVar30 < 2) goto LAB_0010e4bd;
        plVar23 = (long *)((long)plVar23 + uVar30);
        plVar17 = (long *)((long)plVar17 + uVar30);
      }
      uVar25 = (int)plVar24 - (int)piVar22;
      local_90 = (ulong)uVar25;
      lVar27 = 0;
      while( true ) {
        pBVar18 = (BYTE *)((long)piVar22 + lVar27);
        plVar17 = (long *)((long)plVar24 + lVar27);
        if (((pBVar18 <= pBVar34) || (plVar17 <= plVar31)) ||
           (*(char *)((long)plVar24 + lVar27 + -1) != *(char *)((long)piVar22 + lVar27 + -1)))
        break;
        lVar27 = lVar27 + -1;
      }
      local_a4 = uVar25 + 3;
      uVar30 = -lVar27;
      local_c4 = uVar28;
LAB_0010d733:
      sVar19 = ZSTD_count((BYTE *)((long)plVar17 + uVar30 + 4),pBVar18 + uVar30 + 4,(BYTE *)pInLimit
                         );
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_0010e4dc;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0010e4fb;
      uVar35 = (long)plVar17 - (long)plVar31;
      plVar23 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar23 + uVar35))
      goto LAB_0010e51a;
      if (pInLimit < plVar17) goto LAB_0010e539;
      if (plVar2 < plVar17) {
        ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar31,(BYTE *)plVar17,(BYTE *)plVar2);
LAB_0010d7d0:
        seqStore->lit = seqStore->lit + uVar35;
        if (0xffff < uVar35) {
          if (seqStore->longLengthID != 0) goto LAB_0010e5b5;
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar27 = plVar31[1];
        *plVar23 = *plVar31;
        plVar23[1] = lVar27;
        pBVar18 = seqStore->lit;
        if (0x10 < uVar35) {
          lVar27 = (long)(pBVar18 + 0x10) - (long)(plVar31 + 2);
          if (lVar27 < 8) {
            if (-0x10 < lVar27) goto LAB_0010e5f3;
          }
          else if (0xffffffffffffffe0 < lVar27 - 0x10U) goto LAB_0010e5d4;
          lVar27 = plVar31[3];
          *(long *)(pBVar18 + 0x10) = plVar31[2];
          *(long *)(pBVar18 + 0x18) = lVar27;
          if (0x20 < (long)uVar35) {
            lVar27 = 0;
            do {
              puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x20);
              uVar11 = puVar3[1];
              pBVar1 = pBVar18 + lVar27 + 0x20;
              *(undefined8 *)pBVar1 = *puVar3;
              *(undefined8 *)(pBVar1 + 8) = uVar11;
              puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x30);
              uVar11 = puVar3[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar1 + 0x18) = uVar11;
              lVar27 = lVar27 + 0x20;
            } while (pBVar1 + 0x20 < pBVar18 + uVar35);
          }
          goto LAB_0010d7d0;
        }
        seqStore->lit = pBVar18 + uVar35;
      }
      uVar26 = sVar19 + uVar30 + 1;
      psVar36 = seqStore->sequences;
      psVar36->litLength = (U16)uVar35;
      psVar36->offset = local_a4;
      if (0xffff < uVar26) {
        if (seqStore->longLengthID != 0) goto LAB_0010e558;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar36->matchLength = (U16)uVar26;
      psVar36 = psVar36 + 1;
      seqStore->sequences = psVar36;
      plVar23 = (long *)((long)plVar17 + sVar19 + uVar30 + 4);
      plVar17 = (long *)((long)plVar17 + sVar19 + uVar30 + 5);
      plVar31 = plVar23;
      if (plVar23 <= plVar16) {
        if (pBVar8 + (uVar39 & 0xffffffff) + 2 <= src) goto LAB_0010e596;
        pUVar7[(ulong)(*(long *)(pBVar8 + (uVar39 & 0xffffffff) + 2) * -0x30e4432340650000) >>
               (bVar20 & 0x3f)] = UVar38 + 2;
        pUVar7[(ulong)(*(long *)((long)plVar23 - 2) * -0x30e4432340650000) >> (bVar20 & 0x3f)] =
             ((int)plVar23 + -2) - iVar37;
        while( true ) {
          uVar28 = (uint)local_90;
          plVar31 = plVar23;
          if (((local_c4 == 0) || (plVar16 < plVar23)) ||
             ((int)*plVar23 != *(int *)((long)plVar23 - (ulong)local_c4))) break;
          sVar19 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                              (BYTE *)((long)plVar23 + (4 - (ulong)local_c4)),(BYTE *)pInLimit);
          pUVar7[(ulong)(*plVar23 * -0x30e4432340650000) >> (bVar20 & 0x3f)] = (int)plVar23 - iVar37
          ;
          if (seqStore->maxNbSeq <= (ulong)((long)psVar36 - (long)seqStore->sequencesStart >> 3))
          goto LAB_0010e4dc;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0010e4fb;
          plVar17 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < plVar17) goto LAB_0010e51a;
          if (pInLimit < plVar23) goto LAB_0010e539;
          if (plVar2 < plVar23) {
            ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar2);
          }
          else {
            lVar27 = plVar23[1];
            *plVar17 = *plVar23;
            plVar17[1] = lVar27;
          }
          psVar36 = seqStore->sequences;
          psVar36->litLength = 0;
          psVar36->offset = 1;
          if (0xffff < sVar19 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_0010e558;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar17 = (long *)((long)plVar23 + sVar19 + 5);
          plVar23 = (long *)((long)plVar23 + sVar19 + 4);
          psVar36->matchLength = (U16)(sVar19 + 1);
          psVar36 = psVar36 + 1;
          seqStore->sequences = psVar36;
          local_90 = (ulong)local_c4;
          local_c4 = uVar28;
        }
      }
    } while( true );
  }
  if (uVar28 != 7) {
    bVar20 = 0x20 - cVar12;
    plVar2 = pInLimit + -4;
    do {
      lVar27 = -local_90;
      while( true ) {
        uVar28 = (uint)local_90;
        if (plVar16 <= plVar17) goto LAB_0010e445;
        lVar9 = *plVar23;
        uVar29 = (uint)((int)lVar9 * -0x61c8864f) >> (bVar20 & 0x1f);
        lVar10 = *plVar17;
        uVar33 = (uint)((int)lVar10 * -0x61c8864f) >> (bVar20 & 0x1f);
        uVar30 = (long)plVar23 - (long)pBVar8;
        uVar25 = pUVar7[uVar29];
        uVar6 = pUVar7[uVar33];
        UVar38 = (U32)uVar30;
        pUVar7[uVar29] = UVar38;
        pUVar7[uVar33] = (int)plVar17 - iVar37;
        if ((long *)((long)plVar23 + 1U) != plVar17) goto LAB_0010e49e;
        if ((uVar28 != 0) && (*(int *)((long)plVar23 + lVar27 + 2) == *(int *)((long)plVar23 + 2)))
        {
          uVar35 = (ulong)(*(char *)((long)plVar23 + 1U) == *(char *)((long)plVar23 + lVar27 + 1));
          plVar17 = (long *)((long)plVar23 + (2 - uVar35));
          pBVar18 = (BYTE *)((long)plVar23 + ((lVar27 + 2) - uVar35));
          UVar21 = 1;
          goto LAB_0010e0e6;
        }
        if (((uVar14 < uVar25) &&
            (piVar22 = (int *)(pBVar8 + uVar25), plVar24 = plVar23, *piVar22 == (int)lVar9)) ||
           ((uVar14 < uVar6 &&
            (piVar22 = (int *)(pBVar8 + uVar6), plVar24 = plVar17, *piVar22 == (int)lVar10))))
        break;
        uVar30 = ((ulong)((long)plVar23 - (long)plVar31) >> 7) + uVar15;
        if (uVar30 < 2) goto LAB_0010e4bd;
        plVar23 = (long *)((long)plVar23 + uVar30);
        plVar17 = (long *)((long)plVar17 + uVar30);
      }
      uVar25 = (int)plVar24 - (int)piVar22;
      local_90 = (ulong)uVar25;
      lVar27 = 0;
      while( true ) {
        pBVar18 = (BYTE *)((long)piVar22 + lVar27);
        plVar17 = (long *)((long)plVar24 + lVar27);
        if (((pBVar18 <= pBVar34) || (plVar17 <= plVar31)) ||
           (*(char *)((long)plVar24 + lVar27 + -1) != *(char *)((long)piVar22 + lVar27 + -1)))
        break;
        lVar27 = lVar27 + -1;
      }
      UVar21 = uVar25 + 3;
      uVar35 = -lVar27;
      local_c4 = uVar28;
LAB_0010e0e6:
      sVar19 = ZSTD_count((BYTE *)((long)plVar17 + uVar35 + 4),pBVar18 + uVar35 + 4,(BYTE *)pInLimit
                         );
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_0010e4dc;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0010e4fb;
      uVar39 = (long)plVar17 - (long)plVar31;
      plVar23 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar23 + uVar39))
      goto LAB_0010e51a;
      if (pInLimit < plVar17) goto LAB_0010e539;
      if (plVar2 < plVar17) {
        ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar31,(BYTE *)plVar17,(BYTE *)plVar2);
LAB_0010e180:
        seqStore->lit = seqStore->lit + uVar39;
        if (0xffff < uVar39) {
          if (seqStore->longLengthID != 0) goto LAB_0010e5b5;
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar27 = plVar31[1];
        *plVar23 = *plVar31;
        plVar23[1] = lVar27;
        pBVar18 = seqStore->lit;
        if (0x10 < uVar39) {
          lVar27 = (long)(pBVar18 + 0x10) - (long)(plVar31 + 2);
          if (lVar27 < 8) {
            if (-0x10 < lVar27) goto LAB_0010e5f3;
          }
          else if (0xffffffffffffffe0 < lVar27 - 0x10U) goto LAB_0010e5d4;
          lVar27 = plVar31[3];
          *(long *)(pBVar18 + 0x10) = plVar31[2];
          *(long *)(pBVar18 + 0x18) = lVar27;
          if (0x20 < (long)uVar39) {
            lVar27 = 0;
            do {
              puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x20);
              uVar11 = puVar3[1];
              pBVar1 = pBVar18 + lVar27 + 0x20;
              *(undefined8 *)pBVar1 = *puVar3;
              *(undefined8 *)(pBVar1 + 8) = uVar11;
              puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x30);
              uVar11 = puVar3[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar1 + 0x18) = uVar11;
              lVar27 = lVar27 + 0x20;
            } while (pBVar1 + 0x20 < pBVar18 + uVar39);
          }
          goto LAB_0010e180;
        }
        seqStore->lit = pBVar18 + uVar39;
      }
      uVar26 = sVar19 + uVar35 + 1;
      psVar36 = seqStore->sequences;
      psVar36->litLength = (U16)uVar39;
      psVar36->offset = UVar21;
      if (0xffff < uVar26) {
        if (seqStore->longLengthID != 0) goto LAB_0010e558;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar36->matchLength = (U16)uVar26;
      psVar36 = psVar36 + 1;
      seqStore->sequences = psVar36;
      plVar23 = (long *)((long)plVar17 + sVar19 + uVar35 + 4);
      plVar17 = (long *)((long)plVar17 + sVar19 + uVar35 + 5);
      plVar31 = plVar23;
      if (plVar23 <= plVar16) {
        if (pBVar8 + (uVar30 & 0xffffffff) + 2 <= src) goto LAB_0010e596;
        pUVar7[(uint)(*(int *)(pBVar8 + (uVar30 & 0xffffffff) + 2) * -0x61c8864f) >> (bVar20 & 0x1f)
              ] = UVar38 + 2;
        pUVar7[(uint)(*(int *)((long)plVar23 - 2) * -0x61c8864f) >> (bVar20 & 0x1f)] =
             ((int)plVar23 + -2) - iVar37;
        while( true ) {
          uVar28 = (uint)local_90;
          plVar31 = plVar23;
          if ((local_c4 == 0) || (plVar16 < plVar23)) break;
          lVar27 = *plVar23;
          if ((int)lVar27 != *(int *)((long)plVar23 - (ulong)local_c4)) break;
          sVar19 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                              (BYTE *)((long)plVar23 + (4 - (ulong)local_c4)),(BYTE *)pInLimit);
          pUVar7[(uint)((int)lVar27 * -0x61c8864f) >> (bVar20 & 0x1f)] = (int)plVar23 - iVar37;
          if (seqStore->maxNbSeq <= (ulong)((long)psVar36 - (long)seqStore->sequencesStart >> 3))
          goto LAB_0010e4dc;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0010e4fb;
          plVar17 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < plVar17) goto LAB_0010e51a;
          if (pInLimit < plVar23) goto LAB_0010e539;
          if (plVar2 < plVar23) {
            ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar2);
          }
          else {
            lVar27 = plVar23[1];
            *plVar17 = *plVar23;
            plVar17[1] = lVar27;
          }
          psVar36 = seqStore->sequences;
          psVar36->litLength = 0;
          psVar36->offset = 1;
          if (0xffff < sVar19 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_0010e558;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar17 = (long *)((long)plVar23 + sVar19 + 5);
          plVar23 = (long *)((long)plVar23 + sVar19 + 4);
          psVar36->matchLength = (U16)(sVar19 + 1);
          psVar36 = psVar36 + 1;
          seqStore->sequences = psVar36;
          local_90 = (ulong)local_c4;
          local_c4 = uVar28;
        }
      }
    } while( true );
  }
  bVar20 = 0x40 - cVar12;
  plVar2 = pInLimit + -4;
LAB_0010d118:
  lVar27 = -local_90;
  do {
    uVar28 = (uint)local_90;
    if (plVar16 <= plVar17) {
LAB_0010e445:
      uVar14 = 0;
      if (uVar13 < uVar4) {
        uVar14 = uVar4;
      }
      if (uVar13 < uVar5) {
        uVar14 = uVar5;
      }
      if (uVar28 == 0) {
        uVar28 = uVar14;
      }
      if (local_c4 != 0) {
        uVar14 = local_c4;
      }
      *rep = uVar28;
      rep[1] = uVar14;
      return (long)pInLimit - (long)plVar31;
    }
    lVar9 = *plVar23;
    uVar30 = (ulong)(lVar9 * -0x30e44323405a9d00) >> (bVar20 & 0x3f);
    lVar10 = *plVar17;
    uVar35 = (ulong)(lVar10 * -0x30e44323405a9d00) >> (bVar20 & 0x3f);
    uVar39 = (long)plVar23 - (long)pBVar8;
    uVar25 = pUVar7[uVar30];
    uVar6 = pUVar7[uVar35];
    UVar38 = (U32)uVar39;
    pUVar7[uVar30] = UVar38;
    pUVar7[uVar35] = (int)plVar17 - iVar37;
    if ((long *)((long)plVar23 + 1U) != plVar17) {
LAB_0010e49e:
      __assert_fail("ip0 + 1 == ip1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3d56,
                    "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if ((uVar28 != 0) && (*(int *)((long)plVar23 + lVar27 + 2) == *(int *)((long)plVar23 + 2))) {
      uVar30 = (ulong)(*(char *)((long)plVar23 + 1U) == *(char *)((long)plVar23 + lVar27 + 1));
      plVar17 = (long *)((long)plVar23 + (2 - uVar30));
      pBVar18 = (BYTE *)((long)plVar23 + ((lVar27 + 2) - uVar30));
      local_a4 = 1;
      goto LAB_0010d252;
    }
    if (((uVar14 < uVar25) &&
        (piVar22 = (int *)(pBVar8 + uVar25), plVar24 = plVar23, *piVar22 == (int)lVar9)) ||
       ((uVar14 < uVar6 &&
        (piVar22 = (int *)(pBVar8 + uVar6), plVar24 = plVar17, *piVar22 == (int)lVar10)))) break;
    uVar30 = ((ulong)((long)plVar23 - (long)plVar31) >> 7) + uVar15;
    if (uVar30 < 2) {
LAB_0010e4bd:
      __assert_fail("step >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3d6a,
                    "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    plVar23 = (long *)((long)plVar23 + uVar30);
    plVar17 = (long *)((long)plVar17 + uVar30);
  } while( true );
  uVar25 = (int)plVar24 - (int)piVar22;
  local_90 = (ulong)uVar25;
  lVar27 = 0;
  while( true ) {
    pBVar18 = (BYTE *)((long)piVar22 + lVar27);
    plVar17 = (long *)((long)plVar24 + lVar27);
    if (((pBVar18 <= pBVar34) || (plVar17 <= plVar31)) ||
       (*(char *)((long)plVar24 + lVar27 + -1) != *(char *)((long)piVar22 + lVar27 + -1))) break;
    lVar27 = lVar27 + -1;
  }
  local_a4 = uVar25 + 3;
  uVar30 = -lVar27;
  local_c4 = uVar28;
LAB_0010d252:
  sVar19 = ZSTD_count((BYTE *)((long)plVar17 + uVar30 + 4),pBVar18 + uVar30 + 4,(BYTE *)pInLimit);
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_0010e4dc:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_0010e4fb:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar35 = (long)plVar17 - (long)plVar31;
  plVar23 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar23 + uVar35)) {
LAB_0010e51a:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit < plVar17) {
LAB_0010e539:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (plVar2 < plVar17) {
    ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar31,(BYTE *)plVar17,(BYTE *)plVar2);
  }
  else {
    lVar27 = plVar31[1];
    *plVar23 = *plVar31;
    plVar23[1] = lVar27;
    pBVar18 = seqStore->lit;
    if (uVar35 < 0x11) {
      seqStore->lit = pBVar18 + uVar35;
      goto LAB_0010d373;
    }
    lVar27 = (long)(pBVar18 + 0x10) - (long)(plVar31 + 2);
    if (lVar27 < 8) {
      if (-0x10 < lVar27) {
LAB_0010e5f3:
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
    }
    else if (0xffffffffffffffe0 < lVar27 - 0x10U) {
LAB_0010e5d4:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    lVar27 = plVar31[3];
    *(long *)(pBVar18 + 0x10) = plVar31[2];
    *(long *)(pBVar18 + 0x18) = lVar27;
    if (0x20 < (long)uVar35) {
      lVar27 = 0;
      do {
        puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x20);
        uVar11 = puVar3[1];
        pBVar1 = pBVar18 + lVar27 + 0x20;
        *(undefined8 *)pBVar1 = *puVar3;
        *(undefined8 *)(pBVar1 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)plVar31 + lVar27 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar1 + 0x18) = uVar11;
        lVar27 = lVar27 + 0x20;
      } while (pBVar1 + 0x20 < pBVar18 + uVar35);
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthID != 0) {
LAB_0010e5b5:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010d373:
  uVar26 = sVar19 + uVar30 + 1;
  psVar36 = seqStore->sequences;
  psVar36->litLength = (U16)uVar35;
  psVar36->offset = local_a4;
  if (0xffff < uVar26) {
    if (seqStore->longLengthID != 0) {
LAB_0010e558:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar36->matchLength = (U16)uVar26;
  psVar36 = psVar36 + 1;
  seqStore->sequences = psVar36;
  plVar23 = (long *)((long)plVar17 + sVar19 + uVar30 + 4);
  plVar17 = (long *)((long)plVar17 + sVar19 + uVar30 + 5);
  plVar31 = plVar23;
  if (plVar23 <= plVar16) {
    if (pBVar8 + (uVar39 & 0xffffffff) + 2 <= src) {
LAB_0010e596:
      __assert_fail("base+current0+2 > istart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3d84,
                    "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    pUVar7[(ulong)(*(long *)(pBVar8 + (uVar39 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
           (bVar20 & 0x3f)] = UVar38 + 2;
    pUVar7[(ulong)(*(long *)((long)plVar23 - 2) * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] =
         ((int)plVar23 + -2) - iVar37;
    while( true ) {
      uVar28 = (uint)local_90;
      plVar31 = plVar23;
      if (((local_c4 == 0) || (plVar16 < plVar23)) ||
         ((int)*plVar23 != *(int *)((long)plVar23 - (ulong)local_c4))) break;
      sVar19 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                          (BYTE *)((long)plVar23 + (4 - (ulong)local_c4)),(BYTE *)pInLimit);
      pUVar7[(ulong)(*plVar23 * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = (int)plVar23 - iVar37;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar36 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0010e4dc;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0010e4fb;
      plVar17 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar17) goto LAB_0010e51a;
      if (pInLimit < plVar23) goto LAB_0010e539;
      if (plVar2 < plVar23) {
        ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar2);
      }
      else {
        lVar27 = plVar23[1];
        *plVar17 = *plVar23;
        plVar17[1] = lVar27;
      }
      psVar36 = seqStore->sequences;
      psVar36->litLength = 0;
      psVar36->offset = 1;
      if (0xffff < sVar19 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_0010e558;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar36 - (long)seqStore->sequencesStart) >> 3);
      }
      plVar17 = (long *)((long)plVar23 + sVar19 + 5);
      plVar23 = (long *)((long)plVar23 + sVar19 + 4);
      psVar36->matchLength = (U16)(sVar19 + 1);
      psVar36 = psVar36 + 1;
      seqStore->sequences = psVar36;
      local_90 = (ulong)local_c4;
      local_c4 = uVar28;
    }
  }
  goto LAB_0010d118;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}